

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_array_iterator_next
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,BOOL *pdone,int magic)

{
  uint uVar1;
  JSObject *p_00;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue this_obj;
  JSValue JVar2;
  int iVar3;
  BOOL BVar4;
  JSValue *pJVar5;
  JSContext *in_RDI;
  undefined4 *in_R9;
  JSValue JVar6;
  JSValue JVar7;
  JSValue num;
  JSValue args [2];
  JSObject *p;
  JSValue obj;
  JSValue val;
  uint32_t idx;
  uint32_t len;
  JSArrayIteratorData *it;
  JSValue v_1;
  JSValue v;
  JSContext *local_1b8;
  undefined4 in_stack_fffffffffffffe58;
  int32_t iVar8;
  uint32_t in_stack_fffffffffffffe5c;
  undefined4 uVar9;
  JSContext *in_stack_fffffffffffffe60;
  JSValueUnion in_stack_fffffffffffffe68;
  JSContext *in_stack_fffffffffffffe70;
  JSValueUnion in_stack_fffffffffffffe78;
  int64_t in_stack_fffffffffffffe80;
  undefined1 auVar10 [12];
  uint uStack_154;
  uint local_10c;
  int32_t local_d0;
  undefined4 uStack_cc;
  JSContext *local_c8;
  JSValueUnion local_c0;
  int64_t local_b8;
  JSValueUnion local_90;
  int64_t local_88;
  undefined4 uStack_6c;
  JSValueUnion local_60;
  JSContext *local_58;
  JSValueUnion local_30;
  JSContext *local_28;
  undefined4 uStack_c;
  
  JVar6.tag = (int64_t)in_stack_fffffffffffffe70;
  JVar6.u.ptr = in_stack_fffffffffffffe68.ptr;
  pJVar5 = (JSValue *)JS_GetOpaque2(in_stack_fffffffffffffe60,JVar6,in_stack_fffffffffffffe5c);
  if (pJVar5 == (JSValue *)0x0) goto LAB_0016735c;
  iVar3 = JS_IsUndefined(*pJVar5);
  if (iVar3 == 0) {
    p_00 = (JSObject *)(pJVar5->u).ptr;
    if (((p_00->field_0).header.dummy2 < 0x15) || (0x1d < (p_00->field_0).header.dummy2)) {
      JVar7.tag = in_stack_fffffffffffffe80;
      JVar7.u.float64 = in_stack_fffffffffffffe78.float64;
      iVar3 = js_get_length32(in_stack_fffffffffffffe70,(uint32_t *)in_stack_fffffffffffffe68.ptr,
                              JVar7);
      if (iVar3 == 0) goto LAB_00167388;
    }
    else {
      BVar4 = typed_array_is_detached(in_RDI,p_00);
      if (BVar4 == 0) {
        local_10c = (p_00->u).array.count;
LAB_00167388:
        uVar1 = *(uint *)((long)&pJVar5[1].u + 4);
        if (uVar1 < local_10c) {
          *(uint *)((long)&pJVar5[1].u + 4) = uVar1 + 1;
          *in_R9 = 0;
          if (pJVar5[1].u.int32 == 0) {
            if (uVar1 < 0x80000000) {
              local_30._4_4_ = uStack_c;
              local_30.int32 = uVar1;
              local_28 = (JSContext *)0x0;
            }
            else {
              JVar6 = __JS_NewFloat64(in_RDI,(double)uVar1);
              local_60 = JVar6.u;
              local_30 = local_60;
              local_58 = (JSContext *)JVar6.tag;
              local_28 = local_58;
            }
            local_d0 = local_30.int32;
            uStack_cc = local_30._4_4_;
            local_c8 = local_28;
          }
          else {
            this_obj.tag = (int64_t)in_stack_fffffffffffffe70;
            this_obj.u.ptr = in_stack_fffffffffffffe68.ptr;
            JVar7 = JS_GetPropertyUint32
                              (in_stack_fffffffffffffe60,this_obj,in_stack_fffffffffffffe5c);
            local_c8 = (JSContext *)JVar7.tag;
            JVar6 = JVar7;
            iVar3 = JS_IsException(JVar7);
            auVar10 = JVar6._4_12_;
            if (iVar3 == 0) {
              if (pJVar5[1].u.int32 == 1) {
                local_d0 = JVar7.u._0_4_;
                uStack_cc = JVar7.u._4_4_;
              }
              else {
                if (uVar1 < 0x80000000) {
                  local_90._4_4_ = uStack_6c;
                  local_90.int32 = uVar1;
                  local_88 = 0;
                }
                else {
                  JVar6 = __JS_NewFloat64(in_RDI,(double)uVar1);
                  local_c0 = JVar6.u;
                  local_90 = local_c0;
                  local_b8 = JVar6.tag;
                  local_88 = local_b8;
                }
                iVar8 = local_90.int32;
                uVar9 = local_90._4_4_;
                JVar6 = js_create_array(auVar10._4_8_,auVar10._0_4_,(JSValue *)local_c8);
                local_c8 = (JSContext *)JVar6.tag;
                v_01.u._4_4_ = uVar9;
                v_01.u.int32 = iVar8;
                v_01.tag = local_88;
                JS_FreeValue(local_c8,v_01);
                v_02.u._4_4_ = uVar9;
                v_02.u.int32 = iVar8;
                v_02.tag = local_88;
                JS_FreeValue(local_c8,v_02);
                local_d0 = JVar6.u._0_4_;
                uStack_cc = JVar6.u._4_4_;
              }
            }
            else {
              local_d0 = 0;
              local_c8 = (JSContext *)0x6;
            }
          }
          goto LAB_001677e9;
        }
        v_00.u._4_4_ = in_stack_fffffffffffffe5c;
        v_00.u.int32 = in_stack_fffffffffffffe58;
        v_00.tag = (int64_t)in_stack_fffffffffffffe60;
        JS_FreeValue(local_1b8,v_00);
        (pJVar5->u).ptr = (void *)((ulong)uStack_154 << 0x20);
        pJVar5->tag = 3;
        goto LAB_001673f0;
      }
      JS_ThrowTypeErrorDetachedArrayBuffer((JSContext *)0x167311);
    }
LAB_0016735c:
    *in_R9 = 0;
    local_d0 = 0;
    local_c8 = (JSContext *)0x6;
  }
  else {
LAB_001673f0:
    *in_R9 = 1;
    local_d0 = 0;
    local_c8 = (JSContext *)0x3;
  }
LAB_001677e9:
  JVar2.u._4_4_ = uStack_cc;
  JVar2.u.int32 = local_d0;
  JVar2.tag = (int64_t)local_c8;
  return JVar2;
}

Assistant:

static JSValue js_array_iterator_next(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv,
                                      BOOL *pdone, int magic)
{
    JSArrayIteratorData *it;
    uint32_t len, idx;
    JSValue val, obj;
    JSObject *p;

    it = JS_GetOpaque2(ctx, this_val, JS_CLASS_ARRAY_ITERATOR);
    if (!it)
        goto fail1;
    if (JS_IsUndefined(it->obj))
        goto done;
    p = JS_VALUE_GET_OBJ(it->obj);
    if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
        p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
        if (typed_array_is_detached(ctx, p)) {
            JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
            goto fail1;
        }
        len = p->u.array.count;
    } else {
        if (js_get_length32(ctx, &len, it->obj)) {
        fail1:
            *pdone = FALSE;
            return JS_EXCEPTION;
        }
    }
    idx = it->idx;
    if (idx >= len) {
        JS_FreeValue(ctx, it->obj);
        it->obj = JS_UNDEFINED;
    done:
        *pdone = TRUE;
        return JS_UNDEFINED;
    }
    it->idx = idx + 1;
    *pdone = FALSE;
    if (it->kind == JS_ITERATOR_KIND_KEY) {
        return JS_NewUint32(ctx, idx);
    } else {
        val = JS_GetPropertyUint32(ctx, it->obj, idx);
        if (JS_IsException(val))
            return JS_EXCEPTION;
        if (it->kind == JS_ITERATOR_KIND_VALUE) {
            return val;
        } else {
            JSValueConst args[2];
            JSValue num;
            num = JS_NewUint32(ctx, idx);
            args[0] = num;
            args[1] = val;
            obj = js_create_array(ctx, 2, args);
            JS_FreeValue(ctx, val);
            JS_FreeValue(ctx, num);
            return obj;
        }
    }
}